

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

LIBSSH2_CHANNEL *
libssh2_channel_open_ex
          (LIBSSH2_SESSION *session,char *type,uint type_len,uint window_size,uint packet_size,
          char *msg,uint msg_len)

{
  int iVar1;
  time_t start_time;
  int rc;
  time_t entry_time;
  LIBSSH2_CHANNEL *ptr;
  char *msg_local;
  uint packet_size_local;
  uint window_size_local;
  uint type_len_local;
  char *type_local;
  LIBSSH2_SESSION *session_local;
  
  if (session == (LIBSSH2_SESSION *)0x0) {
    session_local = (LIBSSH2_SESSION *)0x0;
  }
  else {
    start_time = time((time_t *)0x0);
    while (((session_local =
                  (LIBSSH2_SESSION *)
                  _libssh2_channel_open
                            (session,type,type_len,window_size,packet_size,(uchar *)msg,
                             (ulong)msg_len), session != (LIBSSH2_SESSION *)0x0 &&
            (session->api_block_mode != 0)) && (session_local == (LIBSSH2_SESSION *)0x0))) {
      iVar1 = libssh2_session_last_errno(session);
      if (iVar1 != -0x25) {
        return (LIBSSH2_CHANNEL *)0x0;
      }
      iVar1 = _libssh2_wait_socket(session,start_time);
      if (iVar1 != 0) {
        return (LIBSSH2_CHANNEL *)0x0;
      }
    }
  }
  return (LIBSSH2_CHANNEL *)session_local;
}

Assistant:

LIBSSH2_API LIBSSH2_CHANNEL *
libssh2_channel_open_ex(LIBSSH2_SESSION *session, const char *type,
                        unsigned int type_len,
                        unsigned int window_size, unsigned int packet_size,
                        const char *msg, unsigned int msg_len)
{
    LIBSSH2_CHANNEL *ptr;

    if(!session)
        return NULL;

    BLOCK_ADJUST_ERRNO(ptr, session,
                       _libssh2_channel_open(session, type, type_len,
                                             window_size, packet_size,
                                             (const unsigned char *)msg,
                                             msg_len));
    return ptr;
}